

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetPropDelay_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  Wln_Ntk_t *pWVar5;
  Wln_Vec_t *pWVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if ((iObj < 0) || ((p->vPathDelays).nSize <= iObj)) {
LAB_0038a50d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar2 = (p->vPathDelays).pArray;
  iVar4 = piVar2[(uint)iObj];
  if (iVar4 < 0) {
    piVar2[(uint)iObj] = 0;
    pWVar5 = p->pNtk;
    pWVar6 = pWVar5->vFanins;
    if (0 < pWVar6[(uint)iObj].nSize) {
      lVar9 = 0;
      do {
        iVar4 = (p->vFanins).nSize;
        if (iVar4 <= iObj) goto LAB_0038a4ee;
        piVar3 = (p->vFanins).pArray;
        lVar8 = (long)piVar3[(uint)iObj];
        if ((lVar8 < 0) || (iVar4 <= piVar3[(uint)iObj])) goto LAB_0038a50d;
        iVar4 = piVar3[lVar8 + lVar9 * 2];
        lVar7 = (long)iVar4;
        if (lVar7 != 0) {
          if (pWVar6[lVar7].nSize == 0) {
            if ((iVar4 < 0) || ((pWVar5->vTypes).nSize <= iVar4)) goto LAB_0038a4ee;
            if ((pWVar5->vTypes).pArray[lVar7] != 3) goto LAB_0038a4b2;
          }
          if ((pWVar5->vTypes).nSize <= iObj) goto LAB_0038a4ee;
          if ((lVar9 == 0) || ((pWVar5->vTypes).pArray[(uint)iObj] != 0x59)) {
            iVar1 = piVar2[(uint)iObj];
            if (piVar3[lVar8 + lVar9 * 2 + 1] == 0) {
              iVar4 = Wln_RetPropDelay_rec(p,iVar4);
            }
            else {
              iVar4 = 0;
            }
            if (iVar4 < iVar1) {
              iVar4 = iVar1;
            }
            piVar2[(uint)iObj] = iVar4;
          }
        }
LAB_0038a4b2:
        lVar9 = lVar9 + 1;
        pWVar5 = p->pNtk;
        pWVar6 = pWVar5->vFanins;
      } while (lVar9 < pWVar6[(uint)iObj].nSize);
    }
    if ((p->vNodeDelays).nSize <= iObj) {
LAB_0038a4ee:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = piVar2[(uint)iObj] + (p->vNodeDelays).pArray[(uint)iObj];
    piVar2[(uint)iObj] = iVar4;
  }
  return iVar4;
}

Assistant:

int Wln_RetPropDelay_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay >= 0 )
        return *pDelay;
    *pDelay = 0;
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        if ( pLink[0] )
            *pDelay = Abc_MaxInt(*pDelay, 0);
        else
            *pDelay = Abc_MaxInt(*pDelay, Wln_RetPropDelay_rec(p, iFanin));
    }
    *pDelay += Vec_IntEntry( &p->vNodeDelays, iObj );
    return *pDelay;
}